

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall
QWidgetTextControl::setTextInteractionFlags(QWidgetTextControl *this,TextInteractionFlags flags)

{
  QWidgetTextControlPrivate *this_00;
  
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  if (((QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
       (this_00->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
       super_QFlagsStorage<Qt::TextInteractionFlag>.i !=
       (QFlagsStorage<Qt::TextInteractionFlag>)
       flags.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
       super_QFlagsStorage<Qt::TextInteractionFlag>.i) &&
     ((this_00->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
      super_QFlagsStorage<Qt::TextInteractionFlag>.i =
           (Int)flags.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                super_QFlagsStorage<Qt::TextInteractionFlag>.i, this_00->hasFocus == true)) {
    QWidgetTextControlPrivate::setCursorVisible
              (this_00,SUB41(((uint)flags.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                                    super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) >> 4,0));
    return;
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }